

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9ReachM(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *local_c0;
  char *pcStack_a8;
  int c;
  char *pLogFileName;
  Gia_ParLlb_t *pPars;
  Gia_ParLlb_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pcStack_a8 = (char *)0x0;
  Pars._104_8_ = argv;
  Llb_ManSetDefaultParams((Gia_ParLlb_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_002b7a52:
  do {
    iVar1 = Extra_UtilGetopt(argc,(char **)Pars._104_8_,"TBFCHSLripcsyzvwh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9ReachM(): There is no AIG.\n");
        return 1;
      }
      iVar1 = Gia_ManRegNum(pAbc->pGia);
      if (iVar1 == 0) {
        Abc_Print(-1,"Abc_CommandAbc9ReachM(): The current AIG has no latches.\n");
        return 0;
      }
      iVar1 = Gia_ManObjNum(pAbc->pGia);
      if (0xffff < iVar1) {
        Abc_Print(-1,
                  "Abc_CommandAbc9ReachM(): Currently cannot handle AIGs with more than %d objects.\n"
                  ,0x10000);
        return 0;
      }
      iVar1 = Llb_ManModelCheckGia(pAbc->pGia,(Gia_ParLlb_t *)&pPars);
      pAbc->Status = iVar1;
      pAbc->nFrames = (int)Pars.TimeTarget;
      Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
      if (pcStack_a8 != (char *)0x0) {
        Abc_NtkWriteLogFile(pcStack_a8,pAbc->pCex,pAbc->Status,pAbc->nFrames,"&reachm");
      }
      return 0;
    }
    switch(iVar1) {
    case 0x42:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-B\" should be followed by an integer.\n");
        goto LAB_002b7fa8;
      }
      pPars._0_4_ = atoi(*(char **)(Pars._104_8_ + (long)globalUtilOptind * 8));
      uVar2 = (uint)pPars;
      break;
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_002b7fa8;
      }
      Pars.nBddMax = atoi(*(char **)(Pars._104_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nBddMax;
      break;
    default:
      goto LAB_002b7fa8;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_002b7fa8;
      }
      pPars._4_4_ = atoi(*(char **)(Pars._104_8_ + (long)globalUtilOptind * 8));
      uVar2 = pPars._4_4_;
      break;
    case 0x48:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-H\" should be followed by an integer.\n");
        goto LAB_002b7fa8;
      }
      Pars.nIterMax = atoi(*(char **)(Pars._104_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nIterMax;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by a file name.\n");
        goto LAB_002b7fa8;
      }
      pcStack_a8 = *(char **)(Pars._104_8_ + (long)globalUtilOptind * 8);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_002b7a52;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_002b7fa8;
      }
      Pars.nClusterMax = atoi(*(char **)(Pars._104_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nClusterMax;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002b7fa8;
      }
      Pars.fSkipReach = atoi(*(char **)(Pars._104_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.fSkipReach;
      break;
    case 99:
      Pars.fIndConstr = Pars.fIndConstr ^ 1;
      goto LAB_002b7a52;
    case 0x68:
      goto LAB_002b7fa8;
    case 0x69:
      Pars.fBackward = Pars.fBackward ^ 1;
      goto LAB_002b7a52;
    case 0x70:
      Pars.fReorder = Pars.fReorder ^ 1;
      goto LAB_002b7a52;
    case 0x72:
      Pars.nPartValue = Pars.nPartValue ^ 1;
      goto LAB_002b7a52;
    case 0x73:
      Pars.fUsePivots = Pars.fUsePivots ^ 1;
      goto LAB_002b7a52;
    case 0x76:
      Pars.fSchedule = Pars.fSchedule ^ 1;
      goto LAB_002b7a52;
    case 0x77:
      Pars.fDumpReached = Pars.fDumpReached ^ 1;
      goto LAB_002b7a52;
    case 0x79:
      Pars.fSilent = Pars.fSilent ^ 1;
      goto LAB_002b7a52;
    case 0x7a:
      Pars.fVeryVerbose = Pars.fVeryVerbose ^ 1;
      goto LAB_002b7a52;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_002b7fa8:
      Abc_Print(-2,"usage: &reachm [-TBFCHS num] [-L file] [-ripcsyzvwh]\n");
      Abc_Print(-2,
                "\t         model checking via BDD-based reachability (dependence-matrix-based)\n");
      Abc_Print(-2,"\t-T num : approximate time limit in seconds (0=infinite) [default = %d]\n",
                (ulong)(uint)Pars.fSkipReach);
      Abc_Print(-2,"\t-B num : max number of nodes in the intermediate BDDs [default = %d]\n",
                (ulong)(uint)pPars);
      Abc_Print(-2,"\t-F num : max number of reachability iterations [default = %d]\n",
                (ulong)pPars._4_4_);
      Abc_Print(-2,"\t-C num : max number of variables in a cluster [default = %d]\n",
                (ulong)(uint)Pars.nBddMax);
      Abc_Print(-2,"\t-H num : max number of hints to use [default = %d]\n",
                (ulong)(uint)Pars.nIterMax);
      Abc_Print(-2,"\t-S num : the number of the starting hint [default = %d]\n",
                (ulong)(uint)Pars.nClusterMax);
      if (pcStack_a8 == (char *)0x0) {
        local_c0 = "no logging";
      }
      else {
        local_c0 = pcStack_a8;
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",local_c0);
      pcVar3 = "no";
      if (Pars.nPartValue != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-r     : enable dynamic BDD variable reordering [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fBackward != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-i     : enable extraction of inductive constraints [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fReorder != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-p     : enable partitions for internal cut-points [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fIndConstr != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-c     : enable clustering of partitions [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fUsePivots != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-s     : enable scheduling of clusters [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fSilent != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-y     : skip checking property outputs [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fVeryVerbose != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-z     : skip reachability (run preparation phase only) [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (Pars.fSchedule != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fDumpReached != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-w     : prints dependency matrix [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9ReachM( Abc_Frame_t * pAbc, int argc, char ** argv )
{
//    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Gia_ParLlb_t Pars, * pPars = &Pars;
    char * pLogFileName = NULL;
    int c;
    extern int Llb_ManModelCheckGia( Gia_Man_t * pGia, Gia_ParLlb_t * pPars );

    // set defaults
    Llb_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "TBFCHSLripcsyzvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBddMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBddMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nClusterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nClusterMax < 0 )
                goto usage;
            break;
        case 'H':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-H\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nHintDepth = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nHintDepth < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->HintFirst = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->HintFirst < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'r':
            pPars->fReorder ^= 1;
            break;
        case 'i':
            pPars->fIndConstr ^= 1;
            break;
        case 'p':
            pPars->fUsePivots ^= 1;
            break;
        case 'c':
            pPars->fCluster ^= 1;
            break;
        case 's':
            pPars->fSchedule ^= 1;
            break;
        case 'y':
            pPars->fSkipOutCheck ^= 1;
            break;
        case 'z':
            pPars->fSkipReach ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReachM(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReachM(): The current AIG has no latches.\n" );
        return 0;
    }
    if ( Gia_ManObjNum(pAbc->pGia) >= (1<<16) )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReachM(): Currently cannot handle AIGs with more than %d objects.\n", (1<<16) );
        return 0;
    }
    pAbc->Status  = Llb_ManModelCheckGia( pAbc->pGia, pPars );
    pAbc->nFrames = pPars->iFrame;
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "&reachm" );
    return 0;

usage:
    Abc_Print( -2, "usage: &reachm [-TBFCHS num] [-L file] [-ripcsyzvwh]\n" );
    Abc_Print( -2, "\t         model checking via BDD-based reachability (dependence-matrix-based)\n" );
    Abc_Print( -2, "\t-T num : approximate time limit in seconds (0=infinite) [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-B num : max number of nodes in the intermediate BDDs [default = %d]\n", pPars->nBddMax );
    Abc_Print( -2, "\t-F num : max number of reachability iterations [default = %d]\n", pPars->nIterMax );
    Abc_Print( -2, "\t-C num : max number of variables in a cluster [default = %d]\n", pPars->nClusterMax );
    Abc_Print( -2, "\t-H num : max number of hints to use [default = %d]\n", pPars->nHintDepth );
    Abc_Print( -2, "\t-S num : the number of the starting hint [default = %d]\n", pPars->HintFirst );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n", pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-r     : enable dynamic BDD variable reordering [default = %s]\n", pPars->fReorder? "yes": "no" );
    Abc_Print( -2, "\t-i     : enable extraction of inductive constraints [default = %s]\n", pPars->fIndConstr? "yes": "no" );
    Abc_Print( -2, "\t-p     : enable partitions for internal cut-points [default = %s]\n", pPars->fUsePivots? "yes": "no" );
    Abc_Print( -2, "\t-c     : enable clustering of partitions [default = %s]\n", pPars->fCluster? "yes": "no" );
    Abc_Print( -2, "\t-s     : enable scheduling of clusters [default = %s]\n", pPars->fSchedule? "yes": "no" );
    Abc_Print( -2, "\t-y     : skip checking property outputs [default = %s]\n", pPars->fSkipOutCheck? "yes": "no" );
    Abc_Print( -2, "\t-z     : skip reachability (run preparation phase only) [default = %s]\n", pPars->fSkipReach? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : prints dependency matrix [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}